

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O0

void __thiscall anurbs::RTree<3L>::PickByBox::PickByBox(PickByBox *this,Vector *box_a,Vector *box_b)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  long local_28;
  Index i;
  Vector *box_b_local;
  Vector *box_a_local;
  PickByBox *this_local;
  
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix(&this->m_box_min);
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix(&this->m_box_max);
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_a,local_28);
    dVar1 = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_b,local_28);
    if (*pdVar2 <= dVar1) {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_b,local_28
                         );
      dVar1 = *pdVar2;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)this,local_28)
      ;
      *pSVar3 = dVar1;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_a,local_28
                         );
      dVar1 = *pdVar2;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                          &this->m_box_max,local_28);
      *pSVar3 = dVar1;
    }
    else {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_a,local_28
                         );
      dVar1 = *pdVar2;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)this,local_28)
      ;
      *pSVar3 = dVar1;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_b,local_28
                         );
      dVar1 = *pdVar2;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                          &this->m_box_max,local_28);
      *pSVar3 = dVar1;
    }
  }
  return;
}

Assistant:

PickByBox(const Vector box_a, const Vector box_b) noexcept
        {
            for (Index i = 0; i < TDimension; i++) {
                if (box_a[i] < box_b[i]) {
                    m_box_min[i] = box_a[i];
                    m_box_max[i] = box_b[i];
                } else {
                    m_box_min[i] = box_b[i];
                    m_box_max[i] = box_a[i];
                }
            }
        }